

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

void * __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::consume_operation::element_ptr(consume_operation *this)

{
  bool bVar1;
  uintptr_t uint_pointer;
  ControlBlock *pCVar2;
  
  bVar1 = detail::
          LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
          ::Consume::empty(&this->m_consume_data);
  if (bVar1) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0x403);
  }
  pCVar2 = (this->m_consume_data).m_control + 2;
  if (((this->m_consume_data).m_next_ptr & 4) != 0) {
    pCVar2 = (ControlBlock *)pCVar2->m_next;
  }
  return pCVar2;
}

Assistant:

void * element_ptr() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return Base::get_element(m_consume_data.m_control, m_consume_data.external());
            }